

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O1

void __thiscall pg::ZLKQSolver::run(ZLKQSolver *this)

{
  bitset *this_00;
  int pe;
  Game *pGVar1;
  char cVar2;
  int *piVar3;
  uint *puVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bitset G;
  _label_vertex local_68;
  bitset local_58;
  bitset *local_38;
  
  this->iterations = 0;
  pGVar1 = (this->super_Solver).game;
  uVar6 = pGVar1->n_vertices;
  piVar3 = (int *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 << 2);
  this->str = piVar3;
  uVar6 = pGVar1->n_vertices;
  (this->Q).pointer = 0;
  puVar4 = (this->Q).queue;
  if (puVar4 != (uint *)0x0) {
    operator_delete__(puVar4);
  }
  puVar4 = (uint *)operator_new__((uVar6 & 0xffffffff) << 2);
  (this->Q).queue = puVar4;
  local_38 = &this->W0;
  bitset::resize(local_38,((this->super_Solver).game)->n_vertices);
  this_00 = &this->W1;
  bitset::resize(this_00,((this->super_Solver).game)->n_vertices);
  local_58._size = ((this->super_Solver).game)->n_vertices;
  uVar8 = local_58._size + 0x3f;
  local_58._bitssize = uVar8 >> 6;
  uVar6 = local_58._bitssize << 3;
  local_58._allocsize = uVar6;
  local_58._bits = (uint64_t *)operator_new__(uVar6);
  if (0x3f < uVar8) {
    memset(local_58._bits,0,uVar6);
  }
  bitset::operator=(&local_58,(this->super_Solver).disabled);
  if (local_58._bitssize != 0) {
    uVar6 = 0;
    do {
      local_58._bits[uVar6] = ~local_58._bits[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_58._bitssize);
  }
  if ((local_58._size & 0x3f) != 0) {
    local_58._bits[local_58._bitssize - 1] =
         local_58._bits[local_58._bitssize - 1] & ~(-1L << (local_58._size & 0x3f));
  }
  pe = (int)((this->super_Solver).game)->n_vertices;
  solve(this,&local_58,pe + -1,pe,pe);
  if (((this->super_Solver).trace != 0) && (0 < ((this->super_Solver).game)->n_vertices)) {
    uVar6 = 0;
    do {
      uVar8 = uVar6 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar8] >> (uVar6 & 0x3f) & 1) == 0) {
        poVar5 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"vertex ",7);
        local_68.g = (this->super_Solver).game;
        local_68.v = (int)uVar6;
        poVar5 = operator<<(poVar5,&local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," is solved by",0xd);
        uVar7 = 1L << (uVar6 & 0x3f);
        if ((local_38->_bits[uVar8] & uVar7) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," even",5);
          if (((((this->super_Solver).game)->_owner)._bits[uVar8] >> (uVar6 & 0x3f) & 1) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," (",2);
            poVar5 = (this->super_Solver).logger;
            if (this->str[uVar6] == -1) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-1",2);
            }
            else {
              local_68.v = this->str[uVar6];
              local_68.g = (this->super_Solver).game;
              operator<<(poVar5,&local_68);
            }
            std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger,")",1);
          }
        }
        if ((this_00->_bits[uVar8] & uVar7) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," odd",4);
          if (((((this->super_Solver).game)->_owner)._bits[uVar8] >> (uVar6 & 0x3f) & 1) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," (",2);
            poVar5 = (this->super_Solver).logger;
            if (this->str[uVar6] == -1) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-1",2);
            }
            else {
              local_68.v = this->str[uVar6];
              local_68.g = (this->super_Solver).game;
              operator<<(poVar5,&local_68);
            }
            std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger,")",1);
          }
        }
        poVar5 = (this->super_Solver).logger;
        cVar2 = (char)poVar5;
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < ((this->super_Solver).game)->n_vertices);
  }
  if (0 < ((this->super_Solver).game)->n_vertices) {
    uVar6 = 0;
    do {
      uVar8 = uVar6 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar8] >> (uVar6 & 0x3f) & 1) == 0) {
        uVar7 = 1L << (uVar6 & 0x3f);
        if ((local_38->_bits[uVar8] & uVar7) != 0) {
          Oink::solve((this->super_Solver).oink,(int)uVar6,0,this->str[uVar6]);
        }
        if ((this_00->_bits[uVar8] & uVar7) != 0) {
          Oink::solve((this->super_Solver).oink,(int)uVar6,1,this->str[uVar6]);
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < ((this->super_Solver).game)->n_vertices);
  }
  poVar5 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"solved with ",0xc);
  poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," iterations.",0xc);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar6 = ((this->super_Solver).game)->n_vertices;
  if (0 < (long)uVar6) {
    uVar8 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
        poVar5 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"search was incomplete!",0x16);
        std::endl<char,std::char_traits<char>>(poVar5);
        exit(-1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  if (local_58._bits != (uint64_t *)0x0) {
    operator_delete__(local_58._bits);
  }
  return;
}

Assistant:

void
ZLKQSolver::run()
{
    iterations = 0;

    str = new int[nodecount()];

    Q.resize(nodecount());
    W0.resize(nodecount());
    W1.resize(nodecount());

    bitset G(nodecount());
    G = disabled;
    G.flip();

    solve(G, nodecount()-1, nodecount(), nodecount());

#ifndef NDEBUG
    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            logger << "vertex " << label_vertex(v) << " is solved by";
            if (W0[v]) {
                logger << " even";
                if (owner(v) == 0) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            if (W1[v]) {
                logger << " odd";
                if (owner(v) == 1) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            logger << std::endl;
        }
    }
#endif

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (W0[v]) Solver::solve(v, 0, str[v]);
        if (W1[v]) Solver::solve(v, 1, str[v]);
    }

    logger << "solved with " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { logger << "search was incomplete!" << std::endl; exit(-1); }
    }
#endif

    delete[] str;
}